

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_ftell(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long *plVar1;
  undefined8 *puVar2;
  jx9_value *pObj;
  jx9_real jVar3;
  uint uVar4;
  char *pcVar5;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (plVar1 = (long *)((*apArg)->x).pOther, plVar1 == (long *)0x0)) ||
     (*(int *)((long)plVar1 + 0x34) != 0xfeac14)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,2,"Expecting an IO handle");
    uVar4 = 8;
    jVar3 = 0.0;
  }
  else {
    puVar2 = (undefined8 *)*plVar1;
    if (puVar2 == (undefined8 *)0x0) {
      pcVar5 = "null_stream";
    }
    else {
      if ((code *)puVar2[0xc] != (code *)0x0) {
        jVar3 = (jx9_real)(*(code *)puVar2[0xc])(plVar1[1]);
        uVar4 = 2;
        goto LAB_0013c4ec;
      }
      pcVar5 = (char *)*puVar2;
    }
    jVar3 = 0.0;
    jx9_context_throw_error_format
              (pCtx,2,
               "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString,pcVar5);
    uVar4 = 8;
  }
LAB_0013c4ec:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar3;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | uVar4;
  return 0;
}

Assistant:

static int jx9Builtin_ftell(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	jx9_int64 iOfft;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xTell == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	iOfft = pStream->xTell(pDev->pHandle);
	/* IO result */
	jx9_result_int64(pCtx, iOfft);
	return JX9_OK;	
}